

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddCacheDefinition
          (cmMakefile *this,string *name,char *value,char *doc,CacheEntryType type,bool force)

{
  pointer pbVar1;
  bool bVar2;
  CacheEntryType CVar3;
  PolicyStatus PVar4;
  cmState *pcVar5;
  pointer pbVar6;
  reference pvVar7;
  string *psVar8;
  cmake *pcVar9;
  PolicyID id;
  string_view val;
  bool local_1fa;
  char *local_1b8;
  cmAlphaNum local_198;
  string local_168;
  cmAlphaNum local_148;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  cmValue local_d0;
  string local_c8;
  string_view local_a8;
  string_view local_98;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  size_type cc;
  undefined1 local_58 [8];
  string nvalue;
  cmValue existingValue;
  bool force_local;
  CacheEntryType type_local;
  char *doc_local;
  char *value_local;
  string *name_local;
  cmMakefile *this_local;
  
  pcVar5 = GetState(this);
  nvalue.field_2._8_8_ = cmState::GetInitializedCacheValue(pcVar5,name);
  std::__cxx11::string::string((string *)local_58);
  bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&nvalue.field_2 + 8));
  doc_local = value;
  if (bVar2) {
    pcVar5 = GetState(this);
    CVar3 = cmState::GetCacheEntryType(pcVar5,name);
    if (CVar3 == UNINITIALIZED) {
      if (!force) {
        cmValue::operator->[abi_cxx11_((cmValue *)((long)&nvalue.field_2 + 8));
        doc_local = (char *)std::__cxx11::string::c_str();
      }
      if ((type == PATH) || (type == FILEPATH)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88);
        if (doc_local == (char *)0x0) {
          local_1b8 = "";
        }
        else {
          local_1b8 = doc_local;
        }
        std::__cxx11::string::operator=((string *)local_58,local_1b8);
        local_98 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
        cmExpandList(local_98,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_88,false);
        std::__cxx11::string::clear();
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while( true ) {
          pbVar1 = files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar6 = (pointer)std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_88);
          if (pbVar6 <= pbVar1) break;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_88,
                                (size_type)
                                files.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          val = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar7);
          local_a8 = val;
          bVar2 = cmIsOff(val);
          if (!bVar2) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_88,
                                  (size_type)
                                  files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmsys::SystemTools::CollapseFullPath(&local_c8,pvVar7);
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_88,
                                  (size_type)
                                  files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)pvVar7,(string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
          }
          if (files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            std::__cxx11::string::operator+=((string *)local_58,";");
          }
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_88,
                                (size_type)
                                files.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator+=((string *)local_58,(string *)pvVar7);
          files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)&(files.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1;
        }
        pcVar9 = GetCMakeInstance(this);
        cmake::AddCacheEntry(pcVar9,name,(string *)local_58,doc,type);
        pcVar5 = GetState(this);
        local_d0 = cmState::GetInitializedCacheValue(pcVar5,name);
        psVar8 = cmValue::operator*[abi_cxx11_(&local_d0);
        std::__cxx11::string::operator=((string *)local_58,(string *)psVar8);
        doc_local = (char *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88);
      }
    }
  }
  pcVar9 = GetCMakeInstance(this);
  cmake::AddCacheEntry(pcVar9,name,doc_local,doc,type);
  PVar4 = GetPolicyStatus(this,CMP0126,false);
  if (PVar4 != OLD) {
    if (PVar4 != WARN) goto LAB_0021f4f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"CMAKE_POLICY_WARNING_CMP0126",&local_f1);
    bVar2 = PolicyOptionalWarningEnabled(this,&local_f0);
    local_1fa = false;
    if (bVar2) {
      local_1fa = IsNormalDefinitionSet(this,name);
    }
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    if (local_1fa != false) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_168,(cmPolicies *)0x7e,id);
      cmAlphaNum::cmAlphaNum(&local_148,&local_168);
      cmAlphaNum::cmAlphaNum
                (&local_198,"\nFor compatibility with older versions of CMake, normal variable \"");
      cmStrCat<std::__cxx11::string,char[42]>
                (&local_118,&local_148,&local_198,name,
                 (char (*) [42])"\" will be removed from the current scope.");
      IssueMessage(this,AUTHOR_WARNING,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_168);
    }
  }
  cmStateSnapshot::RemoveDefinition(&this->StateSnapshot,name);
LAB_0021f4f1:
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmMakefile::AddCacheDefinition(const std::string& name, const char* value,
                                    const char* doc,
                                    cmStateEnums::CacheEntryType type,
                                    bool force)
{
  cmValue existingValue = this->GetState()->GetInitializedCacheValue(name);
  // must be outside the following if() to keep it alive long enough
  std::string nvalue;

  if (existingValue &&
      (this->GetState()->GetCacheEntryType(name) ==
       cmStateEnums::UNINITIALIZED)) {
    // if this is not a force, then use the value from the cache
    // if it is a force, then use the value being passed in
    if (!force) {
      value = existingValue->c_str();
    }
    if (type == cmStateEnums::PATH || type == cmStateEnums::FILEPATH) {
      std::vector<std::string>::size_type cc;
      std::vector<std::string> files;
      nvalue = value ? value : "";

      cmExpandList(nvalue, files);
      nvalue.clear();
      for (cc = 0; cc < files.size(); cc++) {
        if (!cmIsOff(files[cc])) {
          files[cc] = cmSystemTools::CollapseFullPath(files[cc]);
        }
        if (cc > 0) {
          nvalue += ";";
        }
        nvalue += files[cc];
      }

      this->GetCMakeInstance()->AddCacheEntry(name, nvalue, doc, type);
      nvalue = *this->GetState()->GetInitializedCacheValue(name);
      value = nvalue.c_str();
    }
  }
  this->GetCMakeInstance()->AddCacheEntry(name, value, doc, type);
  switch (this->GetPolicyStatus(cmPolicies::CMP0126)) {
    case cmPolicies::WARN:
      if (this->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0126") &&
          this->IsNormalDefinitionSet(name)) {
        this->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0126),
                   "\nFor compatibility with older versions of CMake, normal "
                   "variable \"",
                   name, "\" will be removed from the current scope."));
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // if there was a definition then remove it
      this->StateSnapshot.RemoveDefinition(name);
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      break;
  }
}